

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chests.c
# Opt level: O3

void rewrite_search_take_code(dw_rom *rom,uint8_t *items)

{
  uint8_t *puVar1;
  
  vpatch(rom,0xe231,1,0x55);
  vpatch(rom,0xe23b,1,0x55);
  vpatch(rom,0xe26a,1,0x55);
  vpatch(rom,0xe2ad,1,0x55);
  vpatch(rom,0xe378,1,0x55);
  vpatch(rom,0xe10b,0x2b,0xa2,2,0xa5,0x45,0xdd,0x36,0xe1,0xd0,0x1c,0xa5,0x3a,0xdd,0x39,0xe1,0xd0,
         0x15,0xa5,0x3b,0xdd,0x3c,0xe1,0xd0,0xe,0xbd,0x3f,0xe1,0xf0,99,0x48,0xa9,0xff,0x85,0xe,0x68,
         0x4c,0x24,0xe2,0xca,0x10,0xda,0x4c,0x8a,0xe1);
  vpatch(rom,0xe136,0xc,1,7,3,0x53,9,0x12,0x71,6,0xc,(ulong)*items,(ulong)items[1],(ulong)items[2]);
  puVar1 = rom->content;
  puVar1[0xe142] = 0xff;
  puVar1[0xe143] = 0xff;
  puVar1[0xe144] = 0xff;
  puVar1[0xe145] = 0xff;
  puVar1[0xe146] = 0xff;
  puVar1[0xe147] = 0xff;
  puVar1[0xe148] = 0xff;
  puVar1[0xe149] = 0xff;
  puVar1[0xe14a] = 0xff;
  puVar1[0xe14b] = 0xff;
  puVar1[0xe14c] = 0xff;
  puVar1[0xe14d] = 0xff;
  puVar1[0xe14e] = 0xff;
  puVar1[0xe14f] = 0xff;
  puVar1[0xe150] = 0xff;
  puVar1[0xe151] = 0xff;
  puVar1[0xe152] = 0xff;
  puVar1[0xe153] = 0xff;
  puVar1[0xe154] = 0xff;
  puVar1[0xe155] = 0xff;
  puVar1[0xe156] = 0xff;
  puVar1[0xe157] = 0xff;
  puVar1[0xe158] = 0xff;
  puVar1[0xe159] = 0xff;
  puVar1[0xe15a] = 0xff;
  puVar1[0xe15b] = 0xff;
  puVar1[0xe15c] = 0xff;
  puVar1[0xe15d] = 0xff;
  puVar1[0xe15e] = 0xff;
  puVar1[0xe15f] = 0xff;
  puVar1[0xe160] = 0xff;
  puVar1[0xe161] = 0xff;
  puVar1[0xe162] = 0xff;
  puVar1[0xe163] = 0xff;
  puVar1[0xe164] = 0xff;
  puVar1[0xe165] = 0xff;
  puVar1[0xe166] = 0xff;
  puVar1[0xe167] = 0xff;
  puVar1[0xe168] = 0xff;
  puVar1[0xe169] = 0xff;
  puVar1[0xe16a] = 0xff;
  puVar1[0xe16b] = 0xff;
  puVar1[0xe16c] = 0xff;
  puVar1[0xe16d] = 0xff;
  puVar1[0xe16e] = 0xff;
  puVar1[0xe16f] = 0xff;
  puVar1[0xe170] = 0xff;
  puVar1[0xe171] = 0xff;
  puVar1[0xe172] = 0xff;
  puVar1[0xe173] = 0xff;
  puVar1[0xe174] = 0xff;
  puVar1[0xe175] = 0xff;
  puVar1[0xe176] = 0xff;
  puVar1[0xe177] = 0xff;
  puVar1[0xe178] = 0xff;
  puVar1[0xe179] = 0xff;
  puVar1[0xe17a] = 0xff;
  puVar1[0xe17b] = 0xff;
  puVar1[0xe17c] = 0xff;
  puVar1[0xe17d] = 0xff;
  puVar1[0xe17e] = 0xff;
  puVar1[0xe17f] = 0xff;
  puVar1[0xe180] = 0xff;
  puVar1[0xe181] = 0xff;
  puVar1[0xe182] = 0xff;
  puVar1[0xe183] = 0xff;
  puVar1[0xe184] = 0xff;
  puVar1[0xe185] = 0xff;
  puVar1[0xe186] = 0xff;
  puVar1[0xe187] = 0xff;
  puVar1[0xe188] = 0xff;
  puVar1[0xe189] = 0xff;
  vpatch(rom,0xe2ea,0x7b,0xc9,1,0xd0,0x1b,0xa5,0xbe,0x29,0x1c,0xc9,0x1c,0xf0,0x4f,0xa5,0xbe,9,0x1c,
         0x85,0xbe,0x20,0x55,0xe3,0xa9,0x28,0x20,0xf0,0xdb,0xa9,0xd5,0x4c,0x42,0xd2,0xc9,8,0xd0,0xb,
         0xa9,5,0x20,0x55,0xe0,0xc9,0xff,0xd0,0x2f,0xa9,8,0xc9,10,0xd0,0x14,0xa9,7,0x20,0x55,0xe0,
         0xc9,0xff,0xd0,0x20,0xa9,0xe,0x20,0x55,0xe0,0xc9);
  return;
}

Assistant:

static void rewrite_search_take_code(dw_rom *rom, uint8_t *items)
{
    /* patch a few branch addresses */
    vpatch(rom, 0x0e231,    1,  0x55);
    vpatch(rom, 0x0e23b,    1,  0x55);
    vpatch(rom, 0x0e26a,    1,  0x55);
    vpatch(rom, 0x0e2ad,    1,  0x55);
    vpatch(rom, 0x0e378,    1,  0x55);

    /* new "SEARCH" code */
    vpatch(rom, 0x0e10b,  43,
        0xa2, 0x02,        /*     ldx #02                                    */
        0xa5, 0x45,        /* -   lda MAP_INDEX                              */
        0xdd, 0x36, 0xe1,  /*     cmp search_map,x                           */
        0xd0, 0x1c,        /*     bne +                                      */
        0xa5, 0x3a,        /*     lda X_POS                                  */
        0xdd, 0x39, 0xe1,  /*     cmp search_x,x                             */
        0xd0, 0x15,        /*     bne +                                      */
        0xa5, 0x3b,        /*     lda Y_POS                                  */
        0xdd, 0x3c, 0xe1,  /*     cmp search_y,x                             */
        0xd0, 0x0e,        /*     bne +                                      */
        0xbd, 0x3f, 0xe1,  /*     lda search_item,x                          */
        0xf0, 0x63,        /*     beq $e18a                                  */
        0x48,              /*     pha                                        */
        0xa9, 0xff,        /*     lda #$ff                                   */
        0x85, 0x0e,        /*     sta $0e                                    */
        0x68,              /*     pla                                        */
        0x4c, 0x24,        /*     jmp $e224                                  */
        0xe2, 0xca,        /* +   dex                                        */
        0x10, 0xda,        /*     bpl -                                      */
        0x4c, 0x8a, 0xe1   /*     jmp $e18a                                  */
    );

    /* Searchable item table */
    vpatch(rom, 0x0e136,  12,
    /* search_map:  */
        OVERWORLD,      KOL, HAUKSNESS,
    /* search_x:    */
             0x53,     0x09,      0x12,
    /* search_y:    */
             0x71,     0x06,      0x0c,
    /* search_item: */
         items[0], items[1],  items[2]
    );
    /* This is freed up space. Mark it with ff so we can find it later. */
    memset((void*)&rom->content[0xe142], 0xff, 72);

    /* new "TAKE" code */
    vpatch(rom, 0x0e2ea,  123,
        0xc9,  0x01,        /*     cmp #$01    ; Is it the armor?            */
        0xd0,  0x1b,        /*     bne +                                     */
        0xa5,  0xbe,        /*     lda $be     ; Load the equipment byte     */
        0x29,  0x1c,        /*     and #$1c    ; See if we have the armor    */
        0xc9,  0x1c,        /*     cmp #$1c                                  */
        0xf0,  0x4f,        /*     beq ++      ; The chest is empty          */
        0xa5,  0xbe,        /*     lda $be     ; Load the equipment byte     */
        0x09,  0x1c,        /*     ora #$1c    ; Add the armor               */
        0x85,  0xbe,        /*     sta $be     ; Save it                     */
        0x20,  0x55,  0xe3, /*     jsr +++                                   */
        0xa9,  0x28,        /*     lda #$28                                  */
        0x20,  0xf0,  0xdb, /*     jsr b3_dbf0 ; "You got the armor"         */
        0xa9,  0xd5,        /*     lda #$d5                                  */
        0x4c,  0x42,  0xd2, /*     jmp b3_d242                               */
                            /*                                               */
        0xc9,  0x08,        /* +   cmp #$08    ; If it's not the flute.      */
        0xd0,  0x0b,        /*     bne +       ; Jump to the next check      */
        0xa9,  0x05,        /*     lda #$05    ; Load the flute inv value    */
        0x20,  0x55,  0xe0, /*     jsr $e055   ; Jump to inventory check     */
        0xc9,  0xff,        /*     cmp #$ff    ; Return value is $ff (found) */
        0xd0,  0x2f,        /*     bne ++      ; The chest is empty          */
        0xa9,  0x08,        /*     lda #$08    ; Reset the flute chest value */
        0xc9,  0x0a,        /* +   cmp #$0a    ; If it's not the token       */
        0xd0,  0x14,        /*     bne +       ; Jump to the next check      */
        0xa9,  0x07,        /*     lda #$07    ; Load the token inv value    */
        0x20,  0x55,  0xe0, /*     jsr $e055   ; Jump to inventory check     */
        0xc9,  0xff,        /*     cmp #$ff    ; Return value is $ff (found) */
        0xd0,  0x20,        /*     bne ++      ; The chest is empty          */
        0xa9,  0x0e,        /*     lda #$0e    ; Reset the token chest value */
        0x20,  0x55,  0xe0, /*     jsr $e055                                 */
        0xc9,  0xff,        /*     cmp #$ff                                  */
        0xd0,  0x17,        /*     bne ++                                    */
        0xa9,  0x0a,        /*     lda #$0a                                  */
        0xc9,  0x11,        /* +   cmp #$11    ; If value is >= $11          */
        0xb0,  0x03,        /*     bcs +       ; Jump to the next check      */
        0x4c,  0x69,  0xe2, /*     jmp b3_e269 ; Add the item                */
                            /*                                               */
        0xa9,  0xff,        /* +   lda #$ff                                  */
        0x85,  0x3e,        /*     sta $3e                                   */
        0xa9,  0xf4,        /*     lda #$f4                                  */
        0x85,  0x00,        /*     sta $00                                   */
        0xa9,  0x01,        /*     lda #$01                                  */
        0x85,  0x01,        /*     sta $01                                   */
        0xd0,  0x20,        /*     bne b3_e365                               */
        0xa5,  0x0e,        /* ++  lda $0e                                   */
        0xc9,  0xff,        /*     cmp #$ff                                  */
        0xa9,  0x00,        /*     lda #$00                                  */
        0x85,  0x0e,        /*     sta $0e                                   */
        0xb0,  0x03,        /*     bcs +                                     */
        0x4c,  0xa3,  0xe2, /*     jmp b3_e2a3                               */
        0x4c,  0xc8,  0xe1, /* +   jmp b3_e1c8                               */
                            /*                                               */
                            /*     ; Check the "searched" flag and clear it. */
        0xa5,  0x0e,        /* +++ lda $0e     ; Load the flag               */
        0xc9,  0xff,        /*     cmp #$ff    ; FF indicates search item.   */
        0xa9,  0x00,        /*     lda #$00    ; Clear the flag              */
        0x85,  0x0e,        /*     sta $0e                                   */
        0xb0,  0x66,        /*     bcs b3_e3c5 ; Search: don't play sound    */
        0xf0,  0x39,        /*     beq b3_e39a ; It's a chest.               */ 
        0xff,  0xff,  0xff,  0xff);
}